

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::build_layer_box
          (three_dim_model *this,int *layer_number,IntPoint *a,IntPoint *b,IntPoint *c,IntPoint *d,
          geofile *generated_geofile)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  IntPoint *pIVar4;
  three_dim_model *ptVar5;
  mapped_type *pmVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_> lines_map;
  map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  points_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> plane_surfaces_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  curve_loops_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> volumes_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  surface_loops_map;
  geofile base_shape;
  allocator_type local_435;
  uint local_434;
  IntPoint *local_430;
  vector<int,_std::allocator<int>_> local_428;
  undefined1 local_410 [12];
  undefined4 uStack_404;
  pointer local_400;
  pointer local_3f8;
  double local_3f0;
  int local_3e4;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  IntPoint *local_3c8;
  IntPoint *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  IntPoint *local_3a8;
  ulong local_3a0;
  uint local_398;
  int local_394;
  int local_390;
  uint local_38c;
  three_dim_model *local_388;
  ulong local_380;
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  local_378;
  uint local_348;
  uint local_344;
  undefined8 local_340;
  int local_338;
  int local_334;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  local_318;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_2e8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_2b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_288;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_258;
  geofile local_228;
  
  local_3c8 = c;
  local_3c0 = d;
  pmVar6 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  local_3b8 = CONCAT44(local_3b8._4_4_,pmVar6->z_start);
  pmVar6 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  local_3e4 = pmVar6->thickness;
  GEO::geofile::geofile(&local_228);
  GEO::geofile::switch_to_OpenCASCADE(&local_228);
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258._M_impl.super__Rb_tree_header._M_header;
  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_impl.super__Rb_tree_header._M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar10 = this->pnt_cnt;
  local_3d8 = (ulong)(uint)this->ln_cnt;
  local_380 = (ulong)(uint)this->ps_cnt;
  local_3a0 = (ulong)(uint)this->cl_cnt;
  local_390 = this->sl_cnt;
  local_394 = this->vol_cnt;
  register0x00001200 = (pointer)(double)a->X;
  local_400 = (pointer)(double)a->Y;
  local_430 = (IntPoint *)(double)(int)(uint)local_3b8;
  local_3f0 = this->model_default_char_length;
  local_434 = uVar10 + 1;
  local_410._0_4_ = local_434;
  local_3f8 = (pointer)local_430;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right =
       local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  register0x00001200 = (pointer)(double)b->X;
  local_400 = (pointer)(double)b->Y;
  local_3f0 = this->model_default_char_length;
  uVar7 = uVar10 + 2;
  local_3f8 = (pointer)local_430;
  local_410._0_4_ = uVar7;
  local_3a8 = b;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  register0x00001200 = (pointer)(double)local_3c8->X;
  local_400 = (pointer)(double)local_3c8->Y;
  local_3f0 = this->model_default_char_length;
  uVar15 = uVar10 + 3;
  local_3f8 = (pointer)local_430;
  local_410._0_4_ = uVar15;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  register0x00001200 = (pointer)(double)local_3c0->X;
  local_400 = (pointer)(double)local_3c0->Y;
  local_3f0 = this->model_default_char_length;
  uVar14 = uVar10 + 4;
  local_3f8 = (pointer)local_430;
  local_410._0_4_ = uVar14;
  local_3e0 = (ulong)uVar10;
  local_388 = this;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  iVar1 = (int)local_3d8;
  local_410._0_4_ = iVar1 + 1;
  local_3d0 = (ulong)local_434;
  local_410._4_4_ = local_434;
  local_430 = a;
  local_410._8_4_ = uVar7;
  local_38c = local_410._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 2;
  local_410._4_4_ = uVar7;
  local_410._8_4_ = uVar15;
  local_320 = (ulong)uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 3;
  local_410._4_4_ = uVar15;
  local_410._8_4_ = uVar14;
  local_328 = (ulong)uVar15;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._8_4_ = (undefined4)local_3d0;
  local_410._0_4_ = iVar1 + 4;
  local_410._4_4_ = uVar14;
  local_330 = (ulong)uVar14;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_348 = local_434;
  local_340 = CONCAT44(uVar14,uVar15);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_348;
  local_344 = uVar7;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l,&local_435);
  pIVar4 = local_3c0;
  local_410._0_4_ = (int)local_3a0 + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  ptVar5 = local_388;
  uVar3 = local_3e0;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar10 = (int)local_380 + 1;
  local_410._0_4_ = uVar10;
  local_410._4_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  register0x00001200 = (pointer)(double)local_430->X;
  local_400 = (pointer)(double)local_430->Y;
  local_430 = (IntPoint *)(double)(int)(local_3e4 + (uint)local_3b8);
  local_3f0 = ptVar5->model_default_char_length;
  iVar12 = (int)uVar3;
  local_410._0_4_ = iVar12 + 5;
  local_3b8 = CONCAT44(local_3b8._4_4_,local_410._0_4_);
  local_3f8 = (pointer)local_430;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  register0x00001200 = (pointer)(double)local_3a8->X;
  local_400 = (pointer)(double)local_3a8->Y;
  local_3f0 = ptVar5->model_default_char_length;
  local_434 = iVar12 + 6;
  local_3f8 = (pointer)local_430;
  local_410._0_4_ = local_434;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  register0x00001200 = (pointer)(double)local_3c8->X;
  local_400 = (pointer)(double)local_3c8->Y;
  local_3f0 = ptVar5->model_default_char_length;
  uVar14 = iVar12 + 7;
  local_3f8 = (pointer)local_430;
  local_410._0_4_ = uVar14;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  local_3a8 = (IntPoint *)CONCAT44(local_3a8._4_4_,iVar1 + 4);
  register0x00001200 = (pointer)(double)pIVar4->X;
  local_400 = (pointer)(double)pIVar4->Y;
  local_3f0 = ptVar5->model_default_char_length;
  local_410._0_4_ = iVar12 + 8;
  local_3e0 = (ulong)(uint)local_410._0_4_;
  local_3f8 = (pointer)local_430;
  local_398 = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  uVar10 = local_434;
  iVar1 = (int)local_3d8;
  local_410._0_4_ = iVar1 + 5;
  uVar7 = (uint)local_3b8;
  local_410._4_4_ = (uint)local_3b8;
  local_410._8_4_ = local_434;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 6;
  local_3c0 = (IntPoint *)CONCAT44(local_3c0._4_4_,local_410._0_4_);
  local_430 = (IntPoint *)((ulong)uVar14 << 0x20);
  local_410._4_4_ = uVar10;
  local_410._8_4_ = uVar14;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 7;
  iVar12 = (int)local_3e0;
  local_3c8 = (IntPoint *)(local_3e0 << 0x20);
  local_410._8_4_ = (int)local_3e0;
  local_410._4_4_ = uVar14;
  local_3e4 = local_410._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 8;
  local_410._4_4_ = iVar12;
  local_410._8_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_348 = (uint)local_3b8;
  local_344 = local_434;
  local_340 = CONCAT44((int)local_3e0,uVar14);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_348;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_00,&local_435);
  local_410._0_4_ = (int)local_3a0 + 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  uVar3 = local_380;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar12 = (int)uVar3;
  iVar13 = iVar12 + 2;
  local_410._0_4_ = iVar13;
  local_410._4_4_ = iVar13;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_434 = iVar1 + 9;
  local_410._8_4_ = uVar7 | (uint)(local_3d0 >> 0x20);
  local_410._4_4_ = (undefined4)local_3d0;
  local_410._0_4_ = local_434;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  uVar7 = iVar1 + 10;
  local_410._8_4_ = uVar10 | (uint)(local_320 >> 0x20);
  local_410._4_4_ = (undefined4)local_320;
  local_410._0_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  uVar3 = local_328;
  local_348 = local_38c;
  local_3b8 = CONCAT44(iVar1,iVar1);
  uStack_3b0 = 0;
  local_340 = CONCAT44(-9 - iVar1,-5 - iVar1);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_348;
  local_344 = uVar7;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_01,&local_435);
  iVar1 = (int)local_3a0;
  local_410._0_4_ = iVar1 + 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  local_3d0 = CONCAT44(local_3d0._4_4_,iVar13);
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar13 = iVar12 + 3;
  local_410._0_4_ = iVar13;
  local_410._4_4_ = iVar13;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  uVar10 = (int)local_3d8 + 0xb;
  local_410._4_4_ = (undefined4)((ulong)local_430 | uVar3);
  local_410._8_4_ = (undefined4)(((ulong)local_430 | uVar3) >> 0x20);
  local_410._0_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_344 = local_3c0._0_4_;
  local_340 = CONCAT44(-2 - local_3b8._4_4_,-0xb - (uint)local_3b8);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_348;
  local_348 = uVar7;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_02,&local_435);
  local_410._0_4_ = iVar1 + 4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  uVar3 = local_3d8;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar11 = iVar12 + 4;
  local_410._0_4_ = iVar11;
  local_410._4_4_ = iVar11;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  iVar9 = (int)uVar3;
  local_410._0_4_ = iVar9 + 0xc;
  local_430 = (IntPoint *)CONCAT44(local_430._4_4_,local_410._0_4_);
  local_410._4_4_ = (undefined4)((ulong)local_3c8 | local_330);
  local_410._8_4_ = (undefined4)(((ulong)local_3c8 | local_330) >> 0x20);
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_378,(pair<const_int,_GEO::line> *)local_410);
  local_344 = local_3e4;
  local_340 = CONCAT44(-3 - iVar9,-0xc - iVar9);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_348;
  local_348 = uVar10;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_03,&local_435);
  local_410._0_4_ = iVar1 + 5;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar8 = iVar12 + 5;
  local_410._0_4_ = iVar8;
  local_410._4_4_ = iVar8;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_348 = (uint)local_3a8;
  local_344 = local_434;
  local_340 = CONCAT44(-0xc - iVar9,-8 - (int)local_3d8);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_348;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_04,&local_435);
  local_410._0_4_ = iVar1 + 6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar12 = iVar12 + 6;
  local_410._0_4_ = iVar12;
  local_410._4_4_ = iVar12;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_348 = local_398;
  local_344 = (undefined4)local_3d0;
  local_340 = CONCAT44(iVar11,iVar13);
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)&local_348;
  local_338 = iVar8;
  local_334 = iVar12;
  std::vector<int,_std::allocator<int>_>::vector(&local_428,__l_05,&local_435);
  iVar9 = local_390 + 1;
  local_410._0_4_ = iVar9;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_428);
  iVar13 = local_394;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_258,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_410._0_4_ = iVar13 + 1;
  local_410._4_4_ = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_288,(pair<const_int,_int> *)local_410);
  GEO::geofile::insert_points_map
            (&local_228,
             (map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
              *)&local_318);
  GEO::geofile::insert_lines_map
            (&local_228,
             (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              *)&local_378);
  GEO::geofile::insert_curve_loops_map
            (&local_228,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_2b8);
  GEO::geofile::insert_plane_surfaces_map
            (&local_228,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_2e8);
  GEO::geofile::insert_surface_loops_map
            (&local_228,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_258);
  GEO::geofile::insert_volumes_map
            (&local_228,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_288);
  GEO::geofile::disable_char_len(&local_228);
  generated_geofile->mesh_spacing = local_228.mesh_spacing;
  (generated_geofile->start_time).__d.__r = (rep)local_228.start_time.__d.__r;
  generated_geofile->is_open_cascade = local_228.is_open_cascade;
  generated_geofile->ignore_char_len = local_228.ignore_char_len;
  generated_geofile->bool_diff_rest = local_228.bool_diff_rest;
  *(undefined5 *)&generated_geofile->field_0xb = local_228._11_5_;
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  ::operator=(&(generated_geofile->points_map)._M_t,&local_228.points_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  ::operator=(&(generated_geofile->lines_map)._M_t,&local_228.lines_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->curve_loops_map)._M_t,&local_228.curve_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(generated_geofile->plane_surfaces_map)._M_t,&local_228.plane_surfaces_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->surface_loops_map)._M_t,&local_228.surface_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(generated_geofile->volumes_map)._M_t,&local_228.volumes_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_points_map)._M_t,&local_228.physical_points_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_curves_map)._M_t,&local_228.physical_curves_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_surfaces_map)._M_t,&local_228.physical_surfaces_map._M_t
             );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_volumes_map)._M_t,&local_228.physical_volumes_map._M_t);
  local_388->pnt_cnt = (int)local_3e0;
  local_388->ln_cnt = (int)local_430;
  local_388->cl_cnt = iVar1 + 6;
  local_388->ps_cnt = iVar12;
  local_388->sl_cnt = iVar9;
  local_388->vol_cnt = iVar13 + 1;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_288);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_258);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_2e8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  ::~_Rb_tree(&local_378);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  ::~_Rb_tree(&local_318);
  GEO::geofile::~geofile(&local_228);
  return;
}

Assistant:

void MODEL3D::three_dim_model::build_layer_box(
 const int &layer_number,
const ClipperLib::IntPoint &a,
const ClipperLib::IntPoint &b,
const ClipperLib::IntPoint &c,
const ClipperLib::IntPoint &d,
GEO::geofile &generated_geofile )
{
    int base_height = proc_info_map[layer_number].z_start;
    int thickness = proc_info_map[layer_number].thickness;
    GEO::geofile base_shape;
    base_shape.switch_to_OpenCASCADE();
    std::map<int, GEO::point> points_map;
    std::map<int, GEO::line> lines_map;
    std::map<int, std::vector<int>> curve_loops_map;
    std::map<int, int> plane_surfaces_map;
    std::map<int, std::vector<int>> surface_loops_map;
    std::map<int, int> volumes_map;
    GEO::point one, two, three, four, five, six, seven, eight;
    int point_count = pnt_cnt;
    int line_count = ln_cnt;
    int plane_sur_count = ps_cnt;
    int cur_loop_count = cl_cnt;
    int sur_loop_count = sl_cnt;
    int vol_count = vol_cnt;
    //------- bottom --------
    one.x   = a.X;
    one.y   = a.Y;
    one.z   = base_height;
    one.char_len = model_default_char_length;
    points_map.insert({++point_count, one});
    two.x   = b.X;
    two.y   = b.Y;
    two.z   = base_height;
    two.char_len = model_default_char_length;
    points_map.insert({++point_count, two});
    three.x = c.X;
    three.y = c.Y;
    three.z = base_height;
    three.char_len = model_default_char_length;
    points_map.insert({++point_count, three});
    four.x  = d.X;
    four.y  = d.Y;
    four.z  = base_height;
    four.char_len = model_default_char_length;
    points_map.insert({++point_count, four});
    GEO::line in_line;
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {(point_count-3), (point_count-2), (point_count-1), point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    //-------- top ---------
    five.x   = a.X;
    five.y   = a.Y;
    five.z   = base_height + thickness;
    five.char_len = model_default_char_length;
    points_map.insert({++point_count, five});
    six.x    = b.X;
    six.y    = b.Y;
    six.z    = base_height + thickness;
    six.char_len = model_default_char_length;
    points_map.insert({++point_count, six});
    seven.x  = c.X;
    seven.y  = c.Y;
    seven.z  = base_height + thickness;
    seven.char_len = model_default_char_length;
    points_map.insert({++point_count, seven});
    eight.x  = d.X;
    eight.y  = d.Y;
    eight.z  = base_height + thickness;
    eight.char_len = model_default_char_length;
    points_map.insert({++point_count, eight});
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {point_count-3,point_count-2,point_count-1,point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 1;
    in_line.start = point_count-7;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-6;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-9,line_count,-(line_count-5),-(line_count-1)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 2;
    in_line.start = point_count-5;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 3;
    in_line.start = point_count-4;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 4;
    curve_loops_map.insert({++cur_loop_count, {line_count-8,line_count-3,-(line_count-4),-line_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // enclose
    surface_loops_map.insert({++sur_loop_count, {plane_sur_count-5,plane_sur_count-4,
                                                 plane_sur_count-3,plane_sur_count-2,
                                                 plane_sur_count-1, plane_sur_count}});
    volumes_map.insert({++vol_count, sur_loop_count});
    base_shape.insert_points_map(points_map);
    base_shape.insert_lines_map(lines_map);
    base_shape.insert_curve_loops_map(curve_loops_map);
    base_shape.insert_plane_surfaces_map(plane_surfaces_map);
    base_shape.insert_surface_loops_map(surface_loops_map);
    base_shape.insert_volumes_map(volumes_map);
    base_shape.disable_char_len();
    generated_geofile = base_shape;
    pnt_cnt = point_count;
    ln_cnt = line_count;
    cl_cnt = cur_loop_count;
    ps_cnt = plane_sur_count;
    sl_cnt = sur_loop_count;
    vol_cnt = vol_count;
    // std::string output_path = "data/3DGen/" +
    // std::to_string(layer_number) + "_P_0.geo";
    // base_shape.export_geofile(output_path); //For debugging
    // __asm("nop");
}